

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_fft_fftsg.c
# Opt level: O0

void cftf162(double *a,double *w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double y15i;
  double y15r;
  double y14i;
  double y14r;
  double y13i;
  double y13r;
  double y12i;
  double y12r;
  double y11i;
  double y11r;
  double y10i;
  double y10r;
  double y9i;
  double y9r;
  double y8i;
  double y8r;
  double y7i;
  double y7r;
  double y6i;
  double y6r;
  double y5i;
  double y5r;
  double y4i;
  double y4r;
  double y3i;
  double y3r;
  double y2i;
  double y2r;
  double y1i;
  double y1r;
  double y0i;
  double y0r;
  double x2i;
  double x2r;
  double x1i;
  double x1r;
  double x0i;
  double x0r;
  double wk3i;
  double wk3r;
  double wk2i;
  double wk2r;
  double wk1i;
  double wk1r;
  double wn4r;
  double *w_local;
  double *a_local;
  
  dVar37 = w[1];
  dVar33 = w[4];
  dVar34 = w[5];
  dVar35 = w[6];
  dVar1 = -w[7];
  dVar26 = w[8];
  dVar27 = w[9];
  dVar2 = dVar37 * ((a[8] - a[0x19]) - (a[9] + a[0x18]));
  dVar3 = dVar37 * (a[9] + a[0x18] + (a[8] - a[0x19]));
  dVar4 = (*a - a[0x11]) + dVar2;
  dVar5 = a[1] + a[0x10] + dVar3;
  dVar2 = (*a - a[0x11]) - dVar2;
  dVar3 = (a[1] + a[0x10]) - dVar3;
  dVar6 = dVar37 * ((a[8] + a[0x19]) - (a[9] - a[0x18]));
  dVar7 = dVar37 * ((a[9] - a[0x18]) + a[8] + a[0x19]);
  dVar8 = (*a + a[0x11]) - dVar7;
  dVar9 = (a[1] - a[0x10]) + dVar6;
  dVar7 = *a + a[0x11] + dVar7;
  dVar6 = (a[1] - a[0x10]) - dVar6;
  dVar10 = dVar33 * (a[2] - a[0x13]) + -(dVar34 * (a[3] + a[0x12]));
  dVar11 = dVar33 * (a[3] + a[0x12]) + dVar34 * (a[2] - a[0x13]);
  dVar12 = dVar1 * (a[10] - a[0x1b]) + -(dVar35 * (a[0xb] + a[0x1a]));
  dVar13 = dVar1 * (a[0xb] + a[0x1a]) + dVar35 * (a[10] - a[0x1b]);
  dVar14 = dVar10 + dVar12;
  dVar15 = dVar11 + dVar13;
  dVar10 = dVar10 - dVar12;
  dVar11 = dVar11 - dVar13;
  dVar16 = dVar35 * (a[2] + a[0x13]) + -(dVar1 * (a[3] - a[0x12]));
  dVar17 = dVar35 * (a[3] - a[0x12]) + dVar1 * (a[2] + a[0x13]);
  dVar12 = dVar33 * (a[10] + a[0x1b]) + dVar34 * (a[0xb] - a[0x1a]);
  dVar13 = dVar33 * (a[0xb] - a[0x1a]) + -(dVar34 * (a[10] + a[0x1b]));
  dVar18 = dVar16 - dVar12;
  dVar19 = dVar17 - dVar13;
  dVar16 = dVar16 + dVar12;
  dVar17 = dVar17 + dVar13;
  dVar20 = dVar26 * (a[4] - a[0x15]) + -(dVar27 * (a[5] + a[0x14]));
  dVar21 = dVar26 * (a[5] + a[0x14]) + dVar27 * (a[4] - a[0x15]);
  dVar12 = dVar27 * (a[0xc] - a[0x1d]) + -(dVar26 * (a[0xd] + a[0x1c]));
  dVar13 = dVar27 * (a[0xd] + a[0x1c]) + dVar26 * (a[0xc] - a[0x1d]);
  dVar22 = dVar20 + dVar12;
  dVar23 = dVar21 + dVar13;
  dVar20 = dVar20 - dVar12;
  dVar21 = dVar21 - dVar13;
  dVar24 = dVar27 * (a[4] + a[0x15]) + -(dVar26 * (a[5] - a[0x14]));
  dVar25 = dVar27 * (a[5] - a[0x14]) + dVar26 * (a[4] + a[0x15]);
  dVar12 = dVar26 * (a[0xc] + a[0x1d]) + -(dVar27 * (a[0xd] - a[0x1c]));
  dVar26 = dVar26 * (a[0xd] - a[0x1c]) + dVar27 * (a[0xc] + a[0x1d]);
  dVar27 = dVar24 - dVar12;
  dVar13 = dVar25 - dVar26;
  dVar24 = dVar24 + dVar12;
  dVar25 = dVar25 + dVar26;
  dVar28 = dVar35 * (a[6] - a[0x17]) + -(dVar1 * (a[7] + a[0x16]));
  dVar29 = dVar35 * (a[7] + a[0x16]) + dVar1 * (a[6] - a[0x17]);
  dVar26 = dVar34 * (a[0xe] - a[0x1f]) + -(dVar33 * (a[0xf] + a[0x1e]));
  dVar12 = dVar34 * (a[0xf] + a[0x1e]) + dVar33 * (a[0xe] - a[0x1f]);
  dVar30 = dVar28 + dVar26;
  dVar31 = dVar29 + dVar12;
  dVar28 = dVar28 - dVar26;
  dVar29 = dVar29 - dVar12;
  dVar12 = dVar34 * (a[6] + a[0x17]) + dVar33 * (a[7] - a[0x16]);
  dVar32 = dVar34 * (a[7] - a[0x16]) + -(dVar33 * (a[6] + a[0x17]));
  dVar33 = dVar1 * (a[0xe] + a[0x1f]) + -(dVar35 * (a[0xf] - a[0x1e]));
  dVar34 = dVar1 * (a[0xf] - a[0x1e]) + dVar35 * (a[0xe] + a[0x1f]);
  dVar35 = dVar12 + dVar33;
  dVar26 = dVar32 + dVar34;
  dVar12 = dVar12 - dVar33;
  dVar32 = dVar32 - dVar34;
  dVar33 = dVar4 + dVar22;
  dVar34 = dVar5 + dVar23;
  dVar1 = dVar14 + dVar30;
  dVar36 = dVar15 + dVar31;
  *a = dVar33 + dVar1;
  a[1] = dVar34 + dVar36;
  a[2] = dVar33 - dVar1;
  a[3] = dVar34 - dVar36;
  dVar4 = dVar4 - dVar22;
  dVar5 = dVar5 - dVar23;
  dVar14 = dVar14 - dVar30;
  dVar15 = dVar15 - dVar31;
  a[4] = dVar4 - dVar15;
  a[5] = dVar5 + dVar14;
  a[6] = dVar4 + dVar15;
  a[7] = dVar5 - dVar14;
  dVar33 = dVar2 - dVar21;
  dVar34 = dVar3 + dVar20;
  dVar1 = dVar10 - dVar29;
  dVar22 = dVar11 + dVar28;
  dVar23 = dVar37 * (dVar1 - dVar22);
  dVar1 = dVar37 * (dVar22 + dVar1);
  a[8] = dVar33 + dVar23;
  a[9] = dVar34 + dVar1;
  a[10] = dVar33 - dVar23;
  a[0xb] = dVar34 - dVar1;
  dVar2 = dVar2 + dVar21;
  dVar3 = dVar3 - dVar20;
  dVar10 = dVar10 + dVar29;
  dVar11 = dVar11 - dVar28;
  dVar33 = dVar37 * (dVar10 - dVar11);
  dVar34 = dVar37 * (dVar11 + dVar10);
  a[0xc] = dVar2 - dVar34;
  a[0xd] = dVar3 + dVar33;
  a[0xe] = dVar2 + dVar34;
  a[0xf] = dVar3 - dVar33;
  dVar33 = dVar8 + dVar27;
  dVar34 = dVar9 + dVar13;
  dVar1 = dVar18 - dVar35;
  dVar22 = dVar19 - dVar26;
  a[0x10] = dVar33 + dVar1;
  a[0x11] = dVar34 + dVar22;
  a[0x12] = dVar33 - dVar1;
  a[0x13] = dVar34 - dVar22;
  dVar8 = dVar8 - dVar27;
  dVar9 = dVar9 - dVar13;
  dVar18 = dVar18 + dVar35;
  dVar19 = dVar19 + dVar26;
  a[0x14] = dVar8 - dVar19;
  a[0x15] = dVar9 + dVar18;
  a[0x16] = dVar8 + dVar19;
  a[0x17] = dVar9 - dVar18;
  dVar33 = dVar7 - dVar25;
  dVar34 = dVar6 + dVar24;
  dVar35 = dVar16 + dVar32;
  dVar26 = dVar17 - dVar12;
  dVar27 = dVar37 * (dVar35 - dVar26);
  dVar35 = dVar37 * (dVar26 + dVar35);
  a[0x18] = dVar33 + dVar27;
  a[0x19] = dVar34 + dVar35;
  a[0x1a] = dVar33 - dVar27;
  a[0x1b] = dVar34 - dVar35;
  dVar7 = dVar7 + dVar25;
  dVar6 = dVar6 - dVar24;
  dVar16 = dVar16 - dVar32;
  dVar17 = dVar17 + dVar12;
  dVar33 = dVar37 * (dVar16 - dVar17);
  dVar37 = dVar37 * (dVar17 + dVar16);
  a[0x1c] = dVar7 - dVar37;
  a[0x1d] = dVar6 + dVar33;
  a[0x1e] = dVar7 + dVar37;
  a[0x1f] = dVar6 - dVar33;
  return;
}

Assistant:

void cftf162(FFTFLT *a, FFTFLT *w)
{
    FFTFLT wn4r, wk1r, wk1i, wk2r, wk2i, wk3r, wk3i,
        x0r, x0i, x1r, x1i, x2r, x2i,
        y0r, y0i, y1r, y1i, y2r, y2i, y3r, y3i,
        y4r, y4i, y5r, y5i, y6r, y6i, y7r, y7i,
        y8r, y8i, y9r, y9i, y10r, y10i, y11r, y11i,
        y12r, y12i, y13r, y13i, y14r, y14i, y15r, y15i;

    wn4r = w[1];
    wk1r = w[4];
    wk1i = w[5];
    wk3r = w[6];
    wk3i = -w[7];
    wk2r = w[8];
    wk2i = w[9];
    x1r = a[0] - a[17];
    x1i = a[1] + a[16];
    x0r = a[8] - a[25];
    x0i = a[9] + a[24];
    x2r = wn4r * (x0r - x0i);
    x2i = wn4r * (x0i + x0r);
    y0r = x1r + x2r;
    y0i = x1i + x2i;
    y4r = x1r - x2r;
    y4i = x1i - x2i;
    x1r = a[0] + a[17];
    x1i = a[1] - a[16];
    x0r = a[8] + a[25];
    x0i = a[9] - a[24];
    x2r = wn4r * (x0r - x0i);
    x2i = wn4r * (x0i + x0r);
    y8r = x1r - x2i;
    y8i = x1i + x2r;
    y12r = x1r + x2i;
    y12i = x1i - x2r;
    x0r = a[2] - a[19];
    x0i = a[3] + a[18];
    x1r = wk1r * x0r - wk1i * x0i;
    x1i = wk1r * x0i + wk1i * x0r;
    x0r = a[10] - a[27];
    x0i = a[11] + a[26];
    x2r = wk3i * x0r - wk3r * x0i;
    x2i = wk3i * x0i + wk3r * x0r;
    y1r = x1r + x2r;
    y1i = x1i + x2i;
    y5r = x1r - x2r;
    y5i = x1i - x2i;
    x0r = a[2] + a[19];
    x0i = a[3] - a[18];
    x1r = wk3r * x0r - wk3i * x0i;
    x1i = wk3r * x0i + wk3i * x0r;
    x0r = a[10] + a[27];
    x0i = a[11] - a[26];
    x2r = wk1r * x0r + wk1i * x0i;
    x2i = wk1r * x0i - wk1i * x0r;
    y9r = x1r - x2r;
    y9i = x1i - x2i;
    y13r = x1r + x2r;
    y13i = x1i + x2i;
    x0r = a[4] - a[21];
    x0i = a[5] + a[20];
    x1r = wk2r * x0r - wk2i * x0i;
    x1i = wk2r * x0i + wk2i * x0r;
    x0r = a[12] - a[29];
    x0i = a[13] + a[28];
    x2r = wk2i * x0r - wk2r * x0i;
    x2i = wk2i * x0i + wk2r * x0r;
    y2r = x1r + x2r;
    y2i = x1i + x2i;
    y6r = x1r - x2r;
    y6i = x1i - x2i;
    x0r = a[4] + a[21];
    x0i = a[5] - a[20];
    x1r = wk2i * x0r - wk2r * x0i;
    x1i = wk2i * x0i + wk2r * x0r;
    x0r = a[12] + a[29];
    x0i = a[13] - a[28];
    x2r = wk2r * x0r - wk2i * x0i;
    x2i = wk2r * x0i + wk2i * x0r;
    y10r = x1r - x2r;
    y10i = x1i - x2i;
    y14r = x1r + x2r;
    y14i = x1i + x2i;
    x0r = a[6] - a[23];
    x0i = a[7] + a[22];
    x1r = wk3r * x0r - wk3i * x0i;
    x1i = wk3r * x0i + wk3i * x0r;
    x0r = a[14] - a[31];
    x0i = a[15] + a[30];
    x2r = wk1i * x0r - wk1r * x0i;
    x2i = wk1i * x0i + wk1r * x0r;
    y3r = x1r + x2r;
    y3i = x1i + x2i;
    y7r = x1r - x2r;
    y7i = x1i - x2i;
    x0r = a[6] + a[23];
    x0i = a[7] - a[22];
    x1r = wk1i * x0r + wk1r * x0i;
    x1i = wk1i * x0i - wk1r * x0r;
    x0r = a[14] + a[31];
    x0i = a[15] - a[30];
    x2r = wk3i * x0r - wk3r * x0i;
    x2i = wk3i * x0i + wk3r * x0r;
    y11r = x1r + x2r;
    y11i = x1i + x2i;
    y15r = x1r - x2r;
    y15i = x1i - x2i;
    x1r = y0r + y2r;
    x1i = y0i + y2i;
    x2r = y1r + y3r;
    x2i = y1i + y3i;
    a[0] = x1r + x2r;
    a[1] = x1i + x2i;
    a[2] = x1r - x2r;
    a[3] = x1i - x2i;
    x1r = y0r - y2r;
    x1i = y0i - y2i;
    x2r = y1r - y3r;
    x2i = y1i - y3i;
    a[4] = x1r - x2i;
    a[5] = x1i + x2r;
    a[6] = x1r + x2i;
    a[7] = x1i - x2r;
    x1r = y4r - y6i;
    x1i = y4i + y6r;
    x0r = y5r - y7i;
    x0i = y5i + y7r;
    x2r = wn4r * (x0r - x0i);
    x2i = wn4r * (x0i + x0r);
    a[8] = x1r + x2r;
    a[9] = x1i + x2i;
    a[10] = x1r - x2r;
    a[11] = x1i - x2i;
    x1r = y4r + y6i;
    x1i = y4i - y6r;
    x0r = y5r + y7i;
    x0i = y5i - y7r;
    x2r = wn4r * (x0r - x0i);
    x2i = wn4r * (x0i + x0r);
    a[12] = x1r - x2i;
    a[13] = x1i + x2r;
    a[14] = x1r + x2i;
    a[15] = x1i - x2r;
    x1r = y8r + y10r;
    x1i = y8i + y10i;
    x2r = y9r - y11r;
    x2i = y9i - y11i;
    a[16] = x1r + x2r;
    a[17] = x1i + x2i;
    a[18] = x1r - x2r;
    a[19] = x1i - x2i;
    x1r = y8r - y10r;
    x1i = y8i - y10i;
    x2r = y9r + y11r;
    x2i = y9i + y11i;
    a[20] = x1r - x2i;
    a[21] = x1i + x2r;
    a[22] = x1r + x2i;
    a[23] = x1i - x2r;
    x1r = y12r - y14i;
    x1i = y12i + y14r;
    x0r = y13r + y15i;
    x0i = y13i - y15r;
    x2r = wn4r * (x0r - x0i);
    x2i = wn4r * (x0i + x0r);
    a[24] = x1r + x2r;
    a[25] = x1i + x2i;
    a[26] = x1r - x2r;
    a[27] = x1i - x2i;
    x1r = y12r + y14i;
    x1i = y12i - y14r;
    x0r = y13r - y15i;
    x0i = y13i + y15r;
    x2r = wn4r * (x0r - x0i);
    x2i = wn4r * (x0i + x0r);
    a[28] = x1r - x2i;
    a[29] = x1i + x2r;
    a[30] = x1r + x2i;
    a[31] = x1i - x2r;
}